

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_address.cpp
# Opt level: O2

void __thiscall
AddressApi_ParseOutputDescriptor_Test::TestBody(AddressApi_ParseOutputDescriptor_Test *this)

{
  NetType NVar1;
  long lVar2;
  pointer pTVar3;
  char *pcVar4;
  initializer_list<TestCfdAddressApiDescriptorData> __l;
  AddressApi factory;
  allocator_type local_edd;
  allocator local_edc;
  allocator local_edb;
  allocator local_eda;
  allocator local_ed9;
  allocator local_ed8;
  allocator local_ed7;
  allocator local_ed6;
  allocator local_ed5;
  allocator local_ed4;
  allocator local_ed3;
  allocator local_ed2;
  allocator local_ed1;
  allocator local_ed0;
  allocator local_ecf;
  allocator local_ece;
  allocator local_ecd;
  allocator local_ecc;
  allocator local_ecb;
  allocator local_eca;
  allocator local_ec9;
  allocator local_ec8;
  allocator local_ec7;
  allocator local_ec6;
  allocator local_ec5;
  allocator local_ec4;
  allocator local_ec3;
  allocator local_ec2;
  allocator local_ec1;
  allocator local_ec0;
  allocator local_ebf;
  allocator local_ebe;
  allocator local_ebd;
  allocator local_ebc;
  allocator local_ebb;
  allocator local_eba;
  allocator local_eb9;
  allocator local_eb8;
  allocator local_eb7;
  allocator local_eb6;
  allocator local_eb5;
  allocator local_eb4;
  allocator local_eb3;
  allocator local_eb2;
  allocator local_eb1;
  allocator local_eb0;
  allocator local_eaf;
  allocator local_eae;
  allocator local_ead;
  allocator local_eac;
  allocator local_eab;
  allocator local_eaa;
  allocator local_ea9;
  allocator local_ea8;
  allocator local_ea7;
  allocator local_ea6;
  allocator local_ea5;
  allocator local_ea4;
  allocator local_ea3;
  allocator local_ea2;
  allocator local_ea1;
  allocator local_ea0 [8];
  AssertionResult gtest_ar_1;
  vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>
  g_test_cfd_descriptor_data;
  TestCfdAddressApiDescriptorData test_data;
  AssertionResult gtest_ar;
  DescriptorScriptData data;
  string local_710 [32];
  undefined4 local_6f0;
  string local_6e8 [32];
  undefined4 local_6c8;
  string local_6c0 [32];
  undefined4 local_6a0;
  string local_698 [32];
  undefined4 local_678;
  string local_670 [32];
  undefined8 local_650;
  string local_648 [32];
  undefined4 local_628;
  string local_620 [32];
  undefined4 local_600;
  string local_5f8 [32];
  undefined4 local_5d8;
  string local_5d0 [32];
  undefined4 local_5b0;
  string local_5a8 [32];
  undefined8 local_588;
  string local_580 [32];
  undefined4 local_560;
  string local_558 [32];
  undefined4 local_538;
  string local_530 [32];
  undefined4 local_510;
  string local_508 [32];
  undefined4 local_4e8;
  string local_4e0 [32];
  undefined8 local_4c0;
  string local_4b8 [32];
  undefined4 local_498;
  string local_490 [32];
  undefined4 local_470;
  string local_468 [32];
  undefined4 local_448;
  string local_440 [32];
  undefined4 local_420;
  string local_418 [32];
  undefined8 local_3f8;
  string local_3f0 [32];
  undefined4 local_3d0;
  string local_3c8 [32];
  undefined4 local_3a8;
  string local_3a0 [32];
  undefined4 local_380;
  string local_378 [32];
  undefined4 local_358;
  string local_350 [32];
  undefined8 local_330;
  string local_328 [32];
  undefined4 local_308;
  string local_300 [32];
  undefined4 local_2e0;
  string local_2d8 [32];
  undefined4 local_2b8;
  string local_2b0 [32];
  undefined4 local_290;
  string local_288 [32];
  undefined8 local_268;
  string local_260 [32];
  undefined4 local_240;
  string local_238 [32];
  undefined4 local_218;
  string local_210 [32];
  undefined4 local_1f0;
  string local_1e8 [32];
  undefined4 local_1c8;
  string local_1c0 [32];
  undefined8 local_1a0;
  string local_198 [32];
  undefined4 local_178;
  string local_170 [32];
  undefined4 local_150;
  string local_148 [32];
  undefined4 local_128;
  string local_120 [32];
  undefined4 local_100;
  string local_f8 [32];
  undefined8 local_d8;
  string local_d0 [32];
  undefined4 local_b0;
  string local_a8 [32];
  undefined4 local_88;
  string local_80 [32];
  undefined4 local_60;
  string local_58 [32];
  undefined4 local_38;
  
  std::__cxx11::string::string
            ((string *)&data,
             "pk(02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397)#rk5v7uqw",
             (allocator *)&gtest_ar);
  data.locking_script.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x300000000;
  std::__cxx11::string::string
            ((string *)&data.locking_script.script_stack_,
             "2102a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397ac",
             (allocator *)&test_data);
  data.address = (Address)0x0;
  data._73_3_ = 0;
  std::__cxx11::string::string
            ((string *)&data.field_0x50,"1FoG2386FG2tAJS9acMuiDsKy67aGg9MKz",
             (allocator *)&gtest_ar_1);
  data._112_4_ = 1;
  std::__cxx11::string::string((string *)&data.field_0x78,"",local_ea0);
  data._152_4_ = 1;
  std::__cxx11::string::string
            ((string *)&data.field_0xa0,
             "02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397",
             (allocator *)&factory);
  data._192_4_ = 0;
  std::__cxx11::string::string
            ((string *)&data.field_0xc8,
             "pkh(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)",&local_ea1);
  data._232_8_ = 0x400000000;
  std::__cxx11::string::string
            ((string *)&data.field_0xf0,"76a91406afd46bcdfd22ef94ac122aa11f241244a37ecc88ac",
             &local_ea2);
  data._272_4_ = 0;
  std::__cxx11::string::string
            ((string *)&data.field_0x118,"1cMh228HTCiwS8ZsaakH8A8wze1JR5ZsP",&local_ea3);
  data._312_4_ = 2;
  std::__cxx11::string::string((string *)&data.field_0x140,"",&local_ea4);
  data._352_4_ = 1;
  std::__cxx11::string::string
            ((string *)&data.field_0x168,
             "02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5",&local_ea5);
  data._392_4_ = 0;
  std::__cxx11::string::string
            ((string *)&data.field_0x190,
             "wpkh(02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9)",&local_ea6);
  data._432_8_ = 0x500000000;
  std::__cxx11::string::string
            ((string *)&data.field_0x1b8,"00147dd65592d0ab2fe0d0257d571abf032cd9db93dc",&local_ea7);
  data.redeem_script.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  std::__cxx11::string::string
            ((string *)
             ((long)&data.redeem_script.script_data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),"bc1q0ht9tyks4vh7p5p904t340cr9nvahy7u3re7zg",
             &local_ea8);
  data.key_type = kDescriptorKeySchnorr;
  std::__cxx11::string::string((string *)&data.key,"",&local_ea9);
  data.multisig_req_sig_num = 1;
  std::__cxx11::string::string
            ((string *)&data.branch,
             "02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9",&local_eaa);
  data._592_4_ = 0;
  std::__cxx11::string::string
            ((string *)&data.field_0x258,
             "sh(wpkh(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))",
             &local_eab);
  data._632_8_ = 0x100000000;
  std::__cxx11::string::string
            ((string *)&data.field_0x280,"a914cc6ffbc0bf31af759451068f90ba7a0272b6b33287",&local_eac
            );
  data._672_4_ = 0;
  std::__cxx11::string::string((string *)&data.tree,"3LKyvRN6SmYXGBNn8fcQvYxW9MGKtwcinN",&local_ead)
  ;
  data._712_4_ = 6;
  std::__cxx11::string::string((string *)&data.field_0x2d0,"",&local_eae);
  data._752_4_ = 1;
  std::__cxx11::string::string
            ((string *)&data.field_0x2f8,
             "03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556",&local_eaf);
  data._792_4_ = 0;
  std::__cxx11::string::string
            ((string *)&data.field_0x320,
             "combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)",&local_eb0)
  ;
  std::__cxx11::string::string(local_710,"0014751e76e8199196d454941c45d1b3a323f1433bd6",&local_eb1);
  local_6f0 = 0;
  std::__cxx11::string::string(local_6e8,"bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",&local_eb2);
  local_6c8 = 4;
  std::__cxx11::string::string(local_6c0,"",&local_eb3);
  local_6a0 = 1;
  std::__cxx11::string::string
            (local_698,"0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798",
             &local_eb4);
  local_678 = 0;
  std::__cxx11::string::string
            (local_670,
             "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
             &local_eb5);
  local_650 = 0x100000000;
  std::__cxx11::string::string
            (local_648,"a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",&local_eb6);
  local_628 = 0;
  std::__cxx11::string::string(local_620,"39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",&local_eb7);
  local_600 = 5;
  std::__cxx11::string::string
            (local_5f8,"76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",&local_eb8);
  local_5d8 = 1;
  std::__cxx11::string::string
            (local_5d0,"02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
             &local_eb9);
  local_5b0 = 0;
  std::__cxx11::string::string
            (local_5a8,
             "sh(multi(2,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))"
             ,&local_eba);
  local_588 = 0x100000000;
  std::__cxx11::string::string
            (local_580,"a914a6a8b030a38762f4c1f5cbe387b61a3c5da5cd2687",&local_ebb);
  local_560 = 0;
  std::__cxx11::string::string(local_558,"3GtEB3yg3r5de2cDJG48SkQwxfxJumKQdN",&local_ebc);
  local_538 = 1;
  std::__cxx11::string::string
            (local_530,
             "5221022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a012103acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe52ae"
             ,&local_ebd);
  local_510 = 0;
  std::__cxx11::string::string(local_508,"",&local_ebe);
  local_4e8 = 2;
  std::__cxx11::string::string
            (local_4e0,
             "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))"
             ,&local_ebf);
  local_4c0 = 0x200000000;
  std::__cxx11::string::string
            (local_4b8,"0020773d709598b76c4e3b575c08aad40658963f9322affc0f8c28d1d9a68d0c944a",
             &local_ec0);
  local_498 = 0;
  std::__cxx11::string::string
            (local_490,"bc1qwu7hp9vckakyuw6htsy244qxtztrlyez4l7qlrpg68v6drgvj39qn4zazc",&local_ec1);
  local_470 = 3;
  std::__cxx11::string::string
            (local_468,
             "522103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c72103774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb2103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a53ae"
             ,&local_ec2);
  local_448 = 0;
  std::__cxx11::string::string(local_440,"",&local_ec3);
  local_420 = 2;
  std::__cxx11::string::string
            (local_418,
             "sh(wsh(multi(1,03f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa8,03499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e4,02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))"
             ,&local_ec4);
  local_3f8 = 0x100000000;
  std::__cxx11::string::string
            (local_3f0,"a914aec509e284f909f769bb7dda299a717c87cc97ac87",&local_ec5);
  local_3d0 = 0;
  std::__cxx11::string::string(local_3c8,"3Hd7YQStg9gYpEt6hgK14ZHUABxSURzeuQ",&local_ec6);
  local_3a8 = 5;
  std::__cxx11::string::string
            (local_3a0,
             "512103f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa82103499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e42102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e53ae"
             ,&local_ec7);
  local_380 = 0;
  std::__cxx11::string::string(local_378,"",&local_ec8);
  local_358 = 1;
  std::__cxx11::string::string
            (local_350,"addr(bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9)",
             &local_ec9);
  local_330 = 0x900000000;
  std::__cxx11::string::string
            (local_328,"0020c7a1f1a4d6b4c1802a59631966a18359de779e8a6a65973735a3ccdfdabc407d",
             &local_eca);
  local_308 = 0;
  std::__cxx11::string::string
            (local_300,"bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9",&local_ecb);
  local_2e0 = 3;
  std::__cxx11::string::string(local_2d8,"",&local_ecc);
  local_2b8 = 0;
  std::__cxx11::string::string(local_2b0,"",&local_ecd);
  local_290 = 0;
  std::__cxx11::string::string
            (local_288,
             "raw(6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e)#zf2avljj"
             ,&local_ece);
  local_268 = 0xa00000000;
  std::__cxx11::string::string
            (local_260,
             "6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e"
             ,&local_ecf);
  local_240 = 0;
  std::__cxx11::string::string(local_238,"",&local_ed0);
  local_218 = 1;
  std::__cxx11::string::string(local_210,"",&local_ed1);
  local_1f0 = 0;
  std::__cxx11::string::string(local_1e8,"",&local_ed2);
  local_1c8 = 0;
  std::__cxx11::string::string
            (local_1c0,
             "sh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))"
             ,&local_ed3);
  local_1a0 = 0x100000000;
  std::__cxx11::string::string
            (local_198,"a9148019628fc9b183af5d52ed7dc5c6d56fe6a6325f87",&local_ed4);
  local_178 = 0;
  std::__cxx11::string::string(local_170,"3DNLpswxUiEVyRnAA6mZSvAt7iG6bCu33f",&local_ed5);
  local_150 = 1;
  std::__cxx11::string::string
            (local_148,
             "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac"
             ,&local_ed6);
  local_128 = 0;
  std::__cxx11::string::string(local_120,"",&local_ed7);
  local_100 = 0;
  std::__cxx11::string::string
            (local_f8,
             "sh(wsh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e))))"
             ,&local_ed8);
  local_d8 = 0x100000000;
  std::__cxx11::string::string(local_d0,"a914a7a9f411001e3e3db96d7f02fc9ab1d0dc6aa69187",&local_ed9)
  ;
  local_b0 = 0;
  std::__cxx11::string::string(local_a8,"3GyYN9WnJBoMn8M5tuqVcFJq1BvbAcdPAt",&local_eda);
  local_88 = 5;
  std::__cxx11::string::string
            (local_80,
             "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac"
             ,&local_edb);
  local_60 = 0;
  std::__cxx11::string::string(local_58,"",&local_edc);
  local_38 = 0;
  __l._M_len = 0xd;
  __l._M_array = (iterator)&data;
  std::vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>::
  vector(&g_test_cfd_descriptor_data,__l,&local_edd);
  lVar2 = 0x960;
  do {
    TestCfdAddressApiDescriptorData::~TestCfdAddressApiDescriptorData
              ((TestCfdAddressApiDescriptorData *)((long)&data.type + lVar2));
    lVar2 = lVar2 + -200;
  } while (lVar2 != -200);
  cfd::DescriptorScriptData::DescriptorScriptData(&data);
  for (pTVar3 = g_test_cfd_descriptor_data.
                super__Vector_base<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar3 != g_test_cfd_descriptor_data.
                super__Vector_base<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>
                ._M_impl.super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
    TestCfdAddressApiDescriptorData::TestCfdAddressApiDescriptorData(&test_data,pTVar3);
    NVar1 = test_data.net_type;
    std::__cxx11::string::string((string *)&gtest_ar_1,"",local_ea0);
    cfd::api::AddressApi::ParseOutputDescriptor
              ((string *)&gtest_ar,(NetType)&factory,(string *)&test_data,(vector *)(ulong)NVar1,
               (vector *)&gtest_ar_1,(vector *)0x0,(vector *)0x0);
    cfd::DescriptorScriptData::operator=(&data,(DescriptorScriptData *)&gtest_ar);
    cfd::DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    testing::internal::CmpHelperEQ<cfd::core::DescriptorScriptType,cfd::core::DescriptorScriptType>
              ((internal *)&gtest_ar,"test_data.type","data.type",&test_data.type,&data.type);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_ea0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xdf,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_ea0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ea0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"test_data.locking_script","data.locking_script.GetHex()",
               &test_data.locking_script,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pcVar4 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_ea0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe0,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_ea0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ea0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"test_data.depth","data.depth",&test_data.depth,&data.depth);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_ea0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe1,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_ea0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ea0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::Address::GetAddress_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"test_data.address","data.address.GetAddress()",
               &test_data.address,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pcVar4 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_ea0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe2,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_ea0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ea0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
              ((internal *)&gtest_ar,"test_data.address_type","data.address_type",
               &test_data.address_type,&data.address_type);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_ea0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe3,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_ea0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ea0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"test_data.redeem_script","data.redeem_script.GetHex()",
               &test_data.redeem_script,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pcVar4 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_ea0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe4,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_ea0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ea0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<cfd::core::DescriptorKeyType,cfd::core::DescriptorKeyType>
              ((internal *)&gtest_ar,"test_data.key_type","data.key_type",&test_data.key_type,
               &data.key_type);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_ea0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe5,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_ea0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ea0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar,"test_data.key","data.key",&test_data.key,&data.key);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_ea0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe6,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_ea0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ea0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"test_data.multisig_req_sig_num","data.multisig_req_sig_num",
               &test_data.multisig_req_sig_num,&data.multisig_req_sig_num);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_ea0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe7,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_ea0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ea0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    TestCfdAddressApiDescriptorData::~TestCfdAddressApiDescriptorData(&test_data);
  }
  cfd::DescriptorScriptData::~DescriptorScriptData(&data);
  std::vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>::
  ~vector(&g_test_cfd_descriptor_data);
  return;
}

Assistant:

TEST(AddressApi, ParseOutputDescriptor) {
  std::vector<TestCfdAddressApiDescriptorData> g_test_cfd_descriptor_data {
    {
      "pk(02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397)#rk5v7uqw",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptPk,
      "2102a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397ac",
      0,
      "1FoG2386FG2tAJS9acMuiDsKy67aGg9MKz",
      AddressType::kP2shAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397",
      0
    },
    {
      "pkh(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptPkh,
      "76a91406afd46bcdfd22ef94ac122aa11f241244a37ecc88ac",
      0,
      "1cMh228HTCiwS8ZsaakH8A8wze1JR5ZsP",
      AddressType::kP2pkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5",
      0
    },
    {
      "wpkh(02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptWpkh,
      "00147dd65592d0ab2fe0d0257d571abf032cd9db93dc",
      0,
      "bc1q0ht9tyks4vh7p5p904t340cr9nvahy7u3re7zg",
      AddressType::kP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9",
      0
    },
    {
      "sh(wpkh(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914cc6ffbc0bf31af759451068f90ba7a0272b6b33287",
      0,
      "3LKyvRN6SmYXGBNn8fcQvYxW9MGKtwcinN",
      AddressType::kP2shP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556",
      0
    },
    {
      "combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptCombo,
      "0014751e76e8199196d454941c45d1b3a323f1433bd6",
      0,
      "bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",
      AddressType::kP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798",
      0
    },
    {
      "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",
      0,
      "39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",
      AddressType::kP2shP2wshAddress,
      "76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
      0
    },
    {
      "sh(multi(2,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914a6a8b030a38762f4c1f5cbe387b61a3c5da5cd2687",
      0,
      "3GtEB3yg3r5de2cDJG48SkQwxfxJumKQdN",
      AddressType::kP2shAddress,
      "5221022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a012103acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe52ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      2
    },
    {
      "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptWsh,
      "0020773d709598b76c4e3b575c08aad40658963f9322affc0f8c28d1d9a68d0c944a",
      0,
      "bc1qwu7hp9vckakyuw6htsy244qxtztrlyez4l7qlrpg68v6drgvj39qn4zazc",
      AddressType::kP2wshAddress,
      "522103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c72103774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb2103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a53ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      2
    },
    {
      "sh(wsh(multi(1,03f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa8,03499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e4,02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914aec509e284f909f769bb7dda299a717c87cc97ac87",
      0,
      "3Hd7YQStg9gYpEt6hgK14ZHUABxSURzeuQ",
      AddressType::kP2shP2wshAddress,
      "512103f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa82103499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e42102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e53ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      1
    },
    {
      "addr(bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptAddr,
      "0020c7a1f1a4d6b4c1802a59631966a18359de779e8a6a65973735a3ccdfdabc407d",
      0,
      "bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9",
      AddressType::kP2wshAddress,
      "",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      0
    },
    {
      "raw(6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e)#zf2avljj",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptRaw,
      "6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e",
      0,
      "",
      AddressType::kP2shAddress,
      "",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      0
    },
    {
      "sh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a9148019628fc9b183af5d52ed7dc5c6d56fe6a6325f87",
      0,
      "3DNLpswxUiEVyRnAA6mZSvAt7iG6bCu33f",
      AddressType::kP2shAddress,
      "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      0
    },
    {
      "sh(wsh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e))))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914a7a9f411001e3e3db96d7f02fc9ab1d0dc6aa69187",
      0,
      "3GyYN9WnJBoMn8M5tuqVcFJq1BvbAcdPAt",
      AddressType::kP2shP2wshAddress,
      "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      0
    }
  };

  DescriptorScriptData data;
  AddressApi factory;
  for (auto test_data : g_test_cfd_descriptor_data) {
    try {
      data = factory.ParseOutputDescriptor(
          test_data.descriptor, test_data.net_type);

      EXPECT_EQ(test_data.type, data.type);
      EXPECT_EQ(test_data.locking_script, data.locking_script.GetHex());
      EXPECT_EQ(test_data.depth, data.depth);
      EXPECT_EQ(test_data.address, data.address.GetAddress());
      EXPECT_EQ(test_data.address_type, data.address_type);
      EXPECT_EQ(test_data.redeem_script, data.redeem_script.GetHex());
      EXPECT_EQ(test_data.key_type, data.key_type);
      EXPECT_EQ(test_data.key, data.key);
      EXPECT_EQ(test_data.multisig_req_sig_num, data.multisig_req_sig_num);
    } catch (const std::exception& e) {
      EXPECT_STREQ("", e.what());
      EXPECT_STREQ("", test_data.descriptor.c_str());
    }
  }
}